

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

bool testing::internal::
     TypeParameterizedTest<ParticleTest,_testing::internal::TemplateSel<ParticleTest_Assignment_Test>,_testing::internal::Types2<pica::Particle<(pica::Dimension)2>,_pica::Particle<(pica::Dimension)3>_>_>
     ::Register(char *prefix,char *case_name,char *test_names,int index)

{
  bool bVar1;
  TestFactoryBase *factory;
  char *pcVar2;
  String local_60;
  String local_50;
  String local_40;
  
  pcVar2 = "/";
  if (*prefix == '\0') {
    pcVar2 = "";
  }
  String::Format((char *)&local_40,"%s%s%s/%d",prefix,pcVar2,case_name,(ulong)(uint)index);
  GetPrefixUntilComma((internal *)&local_50,test_names);
  GetTypeName<pica::Particle<(pica::Dimension)2>>();
  factory = (TestFactoryBase *)operator_new(8);
  factory->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_001f7600;
  MakeAndRegisterTestInfo
            (local_40.c_str_,local_50.c_str_,local_60.c_str_,(char *)0x0,
             &TypeIdHelper<ParticleTest<pica::Particle<(pica::Dimension)2>>>::dummy_,
             Test::SetUpTestCase,Test::TearDownTestCase,factory);
  String::~String(&local_60);
  String::~String(&local_50);
  String::~String(&local_40);
  bVar1 = TypeParameterizedTest<ParticleTest,_testing::internal::TemplateSel<ParticleTest_Assignment_Test>,_testing::internal::Types1<pica::Particle<(pica::Dimension)3>_>_>
          ::Register(prefix,case_name,test_names,index + 1);
  return bVar1;
}

Assistant:

static bool Register(const char* prefix, const char* case_name,
                       const char* test_names, int index) {
    typedef typename Types::Head Type;
    typedef Fixture<Type> FixtureClass;
    typedef typename GTEST_BIND_(TestSel, Type) TestClass;

    // First, registers the first type-parameterized test in the type
    // list.
    MakeAndRegisterTestInfo(
        String::Format("%s%s%s/%d", prefix, prefix[0] == '\0' ? "" : "/",
                       case_name, index).c_str(),
        GetPrefixUntilComma(test_names).c_str(),
        GetTypeName<Type>().c_str(),
        NULL,  // No value parameter.
        GetTypeId<FixtureClass>(),
        TestClass::SetUpTestCase,
        TestClass::TearDownTestCase,
        new TestFactoryImpl<TestClass>);

    // Next, recurses (at compile time) with the tail of the type list.
    return TypeParameterizedTest<Fixture, TestSel, typename Types::Tail>
        ::Register(prefix, case_name, test_names, index + 1);
  }